

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

int default_stream_scheduler_update_state(quicly_stream_scheduler_t *self,quicly_stream_t *stream)

{
  int iVar1;
  st_quicly_default_scheduler_state_t *in_RSI;
  st_quicly_default_scheduler_state_t *sched;
  undefined8 in_stack_ffffffffffffffe0;
  quicly_stream_t *stream_00;
  st_quicly_default_scheduler_state_t *sched_00;
  
  stream_00 = (quicly_stream_t *)((in_RSI->active).prev + 0x32);
  iVar1 = quicly_stream_can_send(stream_00,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (iVar1 == 0) {
    iVar1 = quicly_linklist_is_linked(&in_RSI[8].blocked);
    if (iVar1 != 0) {
      quicly_linklist_unlink((quicly_linklist_t *)0x12d36e);
    }
  }
  else {
    sched_00 = in_RSI;
    quicly_is_blocked((quicly_conn_t *)(in_RSI->active).prev);
    link_stream(sched_00,stream_00,(int)((ulong)in_RSI >> 0x20));
  }
  return 0;
}

Assistant:

static int default_stream_scheduler_update_state(quicly_stream_scheduler_t *self, quicly_stream_t *stream)
{
    struct st_quicly_default_scheduler_state_t *sched = &((struct _st_quicly_conn_public_t *)stream->conn)->_default_scheduler;

    if (quicly_stream_can_send(stream, 1)) {
        /* activate if not */
        link_stream(sched, stream, quicly_is_blocked(stream->conn));
    } else {
        /* disactivate if active */
        if (quicly_linklist_is_linked(&stream->_send_aux.pending_link.default_scheduler))
            quicly_linklist_unlink(&stream->_send_aux.pending_link.default_scheduler);
    }

    return 0;
}